

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::draw2DVertexPrimitiveList
          (COpenGLDriver *this,void *vertices,u32 vertexCount,void *indexList,u32 primitiveCount,
          E_VERTEX_TYPE vType,E_PRIMITIVE_TYPE pType,E_INDEX_TYPE iType)

{
  bool bVar1;
  E_INDEX_TYPE EVar2;
  COpenGLDriver *this_00;
  uchar *puVar3;
  GLvoid *pGVar4;
  STextureCache *pSVar5;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *pCVar6;
  int in_EDX;
  long in_RSI;
  CNullDriver *in_RDI;
  int in_R8D;
  E_PRIMITIVE_TYPE in_R9D;
  ITexture *unaff_retaddr;
  int in_stack_00000008;
  u32 in_stack_0000000c;
  E_VERTEX_TYPE in_stack_00000010;
  undefined4 in_stack_00000014;
  GLint colorSize;
  u32 alphaSource;
  E_MODULATE_FUNC modulo;
  E_BLEND_FACTOR dstFact;
  E_BLEND_FACTOR srcFact;
  bool in_stack_0000009d;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  COpenGLDriver *in_stack_000000a0;
  int iVar7;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  E_VERTEX_TYPE EVar8;
  u32 in_stack_ffffffffffffff84;
  E_BLEND_FACTOR *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  u32 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  E_INDEX_TYPE in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  E_PRIMITIVE_TYPE EVar9;
  E_INDEX_TYPE in_stack_ffffffffffffffa4;
  E_PRIMITIVE_TYPE in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  byte bVar10;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  E_PRIMITIVE_TYPE in_stack_ffffffffffffffb0;
  E_VERTEX_TYPE in_stack_ffffffffffffffc0;
  u32 in_stack_ffffffffffffffc4;
  E_INDEX_TYPE EVar11;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  COpenGLDriver *in_stack_ffffffffffffffd0;
  CNullDriver *pCVar12;
  ESetTextureActive esa;
  
  if (in_R8D == 0) {
    return;
  }
  if (in_EDX == 0) {
    return;
  }
  pCVar12 = in_RDI;
  bVar1 = CNullDriver::checkPrimitiveCount(in_RDI,(u32)((ulong)in_RSI >> 0x20));
  esa = (ESetTextureActive)((ulong)pCVar12 >> 0x20);
  if (!bVar1) {
    return;
  }
  iVar7 = in_stack_00000008;
  EVar8 = in_stack_00000010;
  CNullDriver::draw2DVertexPrimitiveList
            ((CNullDriver *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_00000010,in_stack_ffffffffffffffb0,(E_INDEX_TYPE)in_RDI);
  if (((in_RSI != 0) &&
      (((ulong)in_RDI[1].SurfaceWriter.m_data.
               super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0)) &&
     ((*(byte *)((long)in_RDI[1].TransformationMatrix.M + 9) & 1) == 0)) {
    getColorBuffer(in_stack_ffffffffffffffd0,
                   (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  }
  this_00 = (COpenGLDriver *)
            COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::getTextureCache(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                **)&in_RDI[2].OverrideMaterial.Material.field_0xb0);
  SMaterial::getTexture((SMaterial *)(in_RDI + 3),0);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::STextureCache::set
            ((STextureCache *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
             unaff_retaddr,esa);
  if (*(int *)&in_RDI[3].SharedDepthTextures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish == 4) {
    unpack_textureBlendFunc
              ((E_BLEND_FACTOR *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,
               (E_MODULATE_FUNC *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
               (u32 *)CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,
                                        CONCAT15(in_stack_ffffffffffffff7d,
                                                 CONCAT14(in_stack_ffffffffffffff7c,iVar7)))),0.0);
    in_stack_ffffffffffffffaf = (in_stack_ffffffffffffffc8 & 1) != 0;
    SMaterial::getTexture((SMaterial *)(in_RDI + 3),0);
    setRenderStates2DMode(in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d);
  }
  else {
    in_stack_ffffffffffffffae =
         *(int *)&in_RDI[3].SharedDepthTextures.m_data.
                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish == 3;
    SMaterial::getTexture((SMaterial *)(in_RDI + 3),0);
    setRenderStates2DMode(in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d);
  }
  if ((in_stack_00000008 == 0) || (in_stack_00000008 == 7)) {
    COpenGLCacheHandler::setClientState
              ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
               (bool)in_stack_ffffffffffffff7f,(bool)in_stack_ffffffffffffff7e,
               (bool)in_stack_ffffffffffffff7d,(bool)in_stack_ffffffffffffff7c);
  }
  else {
    COpenGLCacheHandler::setClientState
              ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
               (bool)in_stack_ffffffffffffff7f,(bool)in_stack_ffffffffffffff7e,
               (bool)in_stack_ffffffffffffff7d,(bool)in_stack_ffffffffffffff7c);
  }
  bVar10 = 1;
  if (((ulong)in_RDI[1].SurfaceWriter.m_data.
              super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0) {
    bVar10 = *(byte *)((long)in_RDI[1].TransformationMatrix.M + 9);
  }
  EVar2 = 4;
  if ((bVar10 & 1) != 0) {
    EVar2 = 0x80e1;
  }
  if (in_RSI != 0) {
    if ((((ulong)in_RDI[1].SurfaceWriter.m_data.
                 super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0) &&
       ((*(byte *)((long)in_RDI[1].TransformationMatrix.M + 9) & 1) == 0)) {
      EVar11 = EVar2;
      puVar3 = core::array<unsigned_char>::operator[]
                         ((array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
                          CONCAT13(in_stack_ffffffffffffff7f,
                                   CONCAT12(in_stack_ffffffffffffff7e,
                                            CONCAT11(in_stack_ffffffffffffff7d,
                                                     in_stack_ffffffffffffff7c))));
      glColorPointer(EVar2,0x1401,0,puVar3);
      in_stack_ffffffffffffffa4 = EVar2;
      EVar2 = EVar11;
    }
    else {
      in_stack_ffffffffffffffa8 = in_R9D;
      if (in_R9D == EPT_POINTS) {
        glColorPointer(EVar2,0x1401,0x24,in_RSI + 0x18);
      }
      else if (in_R9D == EPT_LINE_STRIP) {
        glColorPointer(EVar2,0x1401,0x2c,in_RSI + 0x18);
      }
      else if (in_R9D == EPT_LINE_LOOP) {
        glColorPointer(EVar2,0x1401,0x3c,in_RSI + 0x18);
      }
    }
  }
  EVar9 = in_R9D;
  if (in_R9D == EPT_POINTS) {
    if (in_RSI == 0) {
      pGVar4 = buffer_offset(0x18);
      glColorPointer(EVar2,0x1401,0x24,pGVar4);
      pGVar4 = buffer_offset(0x1c);
      glTexCoordPointer(2,0x1406,0x24,pGVar4);
      glVertexPointer(2,0x1406,0x24,0);
      in_stack_ffffffffffffff9c = EVar2;
    }
    else {
      glTexCoordPointer(2,0x1406,0x24,in_RSI + 0x1c);
      glVertexPointer(2,0x1406,0x24,in_RSI);
    }
    if (*(byte *)((long)&in_RDI[1].OverrideMaterial.Material.TextureLayers[1].MagFilter + 3) != 0) {
      pSVar5 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ::getTextureCache(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                   **)&in_RDI[2].OverrideMaterial.Material.field_0xb0);
      pCVar6 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ::STextureCache::operator[](pSVar5,1);
      if (pCVar6 != (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) {
        COpenGLCacheHandler::setClientActiveTexture
                  ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,
                                     CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c)))
                  );
        glEnableClientState(0x8078);
        if (in_RSI == 0) {
          pGVar4 = buffer_offset(0x1c);
          glTexCoordPointer(2,0x1406,0x24,pGVar4);
        }
        else {
          glTexCoordPointer(2,0x1406,0x24,in_RSI + 0x1c);
        }
      }
    }
  }
  else if (in_R9D == EPT_LINE_STRIP) {
    if (in_RSI == 0) {
      pGVar4 = buffer_offset(0x18);
      glColorPointer(EVar2,0x1401,0x2c,pGVar4);
      pGVar4 = buffer_offset(0x1c);
      glTexCoordPointer(2,0x1406,0x2c,pGVar4);
      pGVar4 = buffer_offset(0);
      glVertexPointer(2,0x1406,0x2c,pGVar4);
    }
    else {
      glTexCoordPointer(2,0x1406,0x2c,in_RSI + 0x1c);
      glVertexPointer(2,0x1406,0x2c,in_RSI);
    }
    if (*(byte *)((long)&in_RDI[1].OverrideMaterial.Material.TextureLayers[1].MagFilter + 3) != 0) {
      COpenGLCacheHandler::setClientActiveTexture
                ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
                 CONCAT13(in_stack_ffffffffffffff7f,
                          CONCAT12(in_stack_ffffffffffffff7e,
                                   CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c))));
      glEnableClientState(0x8078);
      if (in_RSI == 0) {
        pGVar4 = buffer_offset(0x24);
        glTexCoordPointer(2,0x1406,0x2c,pGVar4);
      }
      else {
        glTexCoordPointer(2,0x1406,0x2c,in_RSI + 0x24);
      }
    }
  }
  else if (in_R9D == EPT_LINE_LOOP) {
    if (in_RSI == 0) {
      pGVar4 = buffer_offset(0x18);
      glColorPointer(EVar2,0x1401,0x3c,pGVar4);
      pGVar4 = buffer_offset(0x1c);
      glTexCoordPointer(2,0x1406,0x3c,pGVar4);
      pGVar4 = buffer_offset(0);
      glVertexPointer(2,0x1406,0x3c,pGVar4);
    }
    else {
      glTexCoordPointer(2,0x1406,0x3c,in_RSI + 0x1c);
      glVertexPointer(2,0x1406,0x3c,in_RSI);
    }
  }
  renderArray(this_00,(void *)CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(in_stack_ffffffffffffffae,
                                                CONCAT15(bVar10,CONCAT14(in_stack_ffffffffffffffac,
                                                                         in_stack_ffffffffffffffa8))
                                               )),in_stack_ffffffffffffffa4,EVar9,
              in_stack_ffffffffffffff9c);
  if (*(byte *)((long)&in_RDI[1].OverrideMaterial.Material.TextureLayers[1].MagFilter + 3) == 0) {
    return;
  }
  if (in_R9D == EPT_POINTS) {
    pSVar5 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ::getTextureCache(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                 **)&in_RDI[2].OverrideMaterial.Material.field_0xb0);
    pCVar6 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ::STextureCache::operator[](pSVar5,1);
    if (pCVar6 == (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) goto LAB_0033c66c;
  }
  COpenGLCacheHandler::setClientActiveTexture
            ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
             CONCAT13(in_stack_ffffffffffffff7f,
                      CONCAT12(in_stack_ffffffffffffff7e,
                               CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c))));
  glDisableClientState(0x8078);
LAB_0033c66c:
  COpenGLCacheHandler::setClientActiveTexture
            ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffff84,EVar8),
             CONCAT13(in_stack_ffffffffffffff7f,
                      CONCAT12(in_stack_ffffffffffffff7e,
                               CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c))));
  return;
}

Assistant:

void COpenGLDriver::draw2DVertexPrimitiveList(const void *vertices, u32 vertexCount,
		const void *indexList, u32 primitiveCount,
		E_VERTEX_TYPE vType, scene::E_PRIMITIVE_TYPE pType, E_INDEX_TYPE iType)
{
	if (!primitiveCount || !vertexCount)
		return;

	if (!checkPrimitiveCount(primitiveCount))
		return;

	CNullDriver::draw2DVertexPrimitiveList(vertices, vertexCount, indexList, primitiveCount, vType, pType, iType);

	if (vertices && !FeatureAvailable[IRR_ARB_vertex_array_bgra] && !FeatureAvailable[IRR_EXT_vertex_array_bgra])
		getColorBuffer(vertices, vertexCount, vType);

	// draw everything
	CacheHandler->getTextureCache().set(0, Material.getTexture(0));
	if (Material.MaterialType == EMT_ONETEXTURE_BLEND) {
		E_BLEND_FACTOR srcFact;
		E_BLEND_FACTOR dstFact;
		E_MODULATE_FUNC modulo;
		u32 alphaSource;
		unpack_textureBlendFunc(srcFact, dstFact, modulo, alphaSource, Material.MaterialTypeParam);
		setRenderStates2DMode(alphaSource & video::EAS_VERTEX_COLOR, (Material.getTexture(0) != 0), (alphaSource & video::EAS_TEXTURE) != 0);
	} else
		setRenderStates2DMode(Material.MaterialType == EMT_TRANSPARENT_VERTEX_ALPHA, (Material.getTexture(0) != 0), Material.MaterialType == EMT_TRANSPARENT_ALPHA_CHANNEL);

	if ((pType != scene::EPT_POINTS) && (pType != scene::EPT_POINT_SPRITES))
		CacheHandler->setClientState(true, false, true, true);
	else
		CacheHandler->setClientState(true, false, true, false);

// due to missing defines in OSX headers, we have to be more specific with this check
// #if defined(GL_ARB_vertex_array_bgra) || defined(GL_EXT_vertex_array_bgra)
#ifdef GL_BGRA
	const GLint colorSize = (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) ? GL_BGRA : 4;
#else
	const GLint colorSize = 4;
#endif
	if (vertices) {
		if (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) {
			switch (vType) {
			case EVT_STANDARD:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].Color);
				break;
			case EVT_2TCOORDS:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].Color);
				break;
			case EVT_TANGENTS:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].Color);
				break;
			}
		} else {
			// avoid passing broken pointer to OpenGL
			_IRR_DEBUG_BREAK_IF(ColorBuffer.size() == 0);
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, 0, &ColorBuffer[0]);
		}
	}

	switch (vType) {
	case EVT_STANDARD:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), 0);
		}

		if (Feature.MaxTextureUnits > 0 && CacheHandler->getTextureCache()[1]) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glEnableClientState(GL_TEXTURE_COORD_ARRAY);
			if (vertices)
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].TCoords);
			else
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), buffer_offset(28));
		}
		break;
	case EVT_2TCOORDS:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex2TCoords), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(0));
		}

		if (Feature.MaxTextureUnits > 0) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glEnableClientState(GL_TEXTURE_COORD_ARRAY);
			if (vertices)
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].TCoords2);
			else
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(36));
		}
		break;
	case EVT_TANGENTS:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertexTangents), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), buffer_offset(0));
		}

		break;
	}

	renderArray(indexList, primitiveCount, pType, iType);

	if (Feature.MaxTextureUnits > 0) {
		if ((vType != EVT_STANDARD) || CacheHandler->getTextureCache()[1]) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glDisableClientState(GL_TEXTURE_COORD_ARRAY);
		}
		CacheHandler->setClientActiveTexture(GL_TEXTURE0);
	}
}